

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

void __thiscall icu_63::ModulusSubstitution::toString(ModulusSubstitution *this,UnicodeString *text)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  if (this->ruleToUse != (NFRule *)0x0) {
    uVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    uVar2 = 2;
    if ((uVar1 & 1) == 0) {
      uVar2 = uVar1 & 0x1e;
    }
    (text->fUnion).fStackFields.fLengthAndFlags = uVar2;
    uStack_18 = in_RAX;
    iVar3 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])(this);
    uStack_18._0_4_ = CONCAT22((short)iVar3,(undefined2)uStack_18);
    UnicodeString::doAppend(text,(UChar *)((long)&uStack_18 + 2),0,1);
    iVar3 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])(this);
    uStack_18._0_6_ = CONCAT24((short)iVar3,(undefined4)uStack_18);
    UnicodeString::doAppend(text,(UChar *)((long)&uStack_18 + 4),0,1);
    iVar3 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xd])(this);
    uStack_18 = CONCAT26((short)iVar3,(undefined6)uStack_18);
    UnicodeString::doAppend(text,(UChar *)((long)&uStack_18 + 6),0,1);
    return;
  }
  NFSubstitution::toString(&this->super_NFSubstitution,text);
  return;
}

Assistant:

void
ModulusSubstitution::toString(UnicodeString& text) const
{
  // use tokenChar() to get the character at the beginning and
  // end of the substitutin token.  In between them will go
  // either the name of the rule set it uses, or the pattern of
  // the DecimalFormat it uses

  if ( ruleToUse != NULL ) { // Must have been a >>> substitution.
      text.remove();
      text.append(tokenChar());
      text.append(tokenChar());
      text.append(tokenChar());
  } else { // Otherwise just use the super-class function.
	  NFSubstitution::toString(text);
  }
}